

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovea<(moira::Instr)72,(moira::Mode)6,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)6,_4> src;
  undefined1 local_34 [20];
  
  Op<(moira::Mode)6,4>((Ea<(moira::Mode)6,_4> *)local_34,this,op & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)6,_4> *)local_34);
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(An)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmMovea(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}